

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

stmm_generator * stmm_init_gen(stmm_table *table)

{
  stmm_generator *gen;
  stmm_table *table_local;
  
  table_local = (stmm_table *)malloc(0x18);
  if (table_local == (stmm_table *)0x0) {
    table_local = (stmm_table *)0x0;
  }
  else {
    table_local->compare = (stmm_compare_func_type)table;
    table_local->hash = (stmm_hash_func_type)0x0;
    table_local->num_bins = 0;
  }
  return (stmm_generator *)table_local;
}

Assistant:

stmm_generator *
stmm_init_gen (stmm_table *table)
{
    stmm_generator *gen;

    gen = ABC_ALLOC(stmm_generator, 1);
    if (gen == NULL) {
    return NULL;
    }
    gen->table = table;
    gen->entry = NULL;
    gen->index = 0;
    return gen;
}